

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O1

void __thiscall ghc::options::options(options *this,int argc,char **argv,size_t offset)

{
  _Rb_tree_header *p_Var1;
  allocator_type local_3a;
  allocator<char> local_39;
  string *local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,*argv,&local_39);
  local_38 = &this->_current;
  (this->_current)._M_dataplus._M_p = (pointer)&(this->_current).field_2;
  (this->_current)._M_string_length = 0;
  (this->_current).field_2._M_local_buf[0] = '\0';
  (this->_next)._M_dataplus._M_p = (pointer)&(this->_next).field_2;
  (this->_next)._M_string_length = 0;
  (this->_next).field_2._M_local_buf[0] = '\0';
  (this->_argiter)._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->_cmdargs,
             argv + offset,argv + argc,&local_3a);
  p_Var1 = &(this->_options)._M_t._M_impl.super__Rb_tree_header;
  (this->_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_options)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->_missing_argument_hamdler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_missing_argument_hamdler).super__Function_base._M_functor + 8) = 0;
  (this->_missing_argument_hamdler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_missing_argument_hamdler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_unknown_option_handler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_unknown_option_handler).super__Function_base._M_functor + 8) = 0;
  (this->_unknown_option_handler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_unknown_option_handler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_positional_handler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_positional_handler).super__Function_base._M_functor + 8) = 0;
  (this->_positional_handler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_positional_handler)._M_invoker = (_Invoker_type)0x0;
  (this->_positional_description)._M_dataplus._M_p =
       (pointer)&(this->_positional_description).field_2;
  (this->_positional_description)._M_string_length = 0;
  (this->_positional_description).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

options(const int argc, char** argv, size_t offset = 1)
    : _arg0(argv[0])
    , _cmdargs(argv + offset, argv + argc)
    {
    }